

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_parse_dhmfile(mbedtls_dhm_context *dhm,char *path)

{
  uchar *local_38;
  uchar *buf;
  size_t n;
  char *pcStack_20;
  int ret;
  char *path_local;
  mbedtls_dhm_context *dhm_local;
  
  pcStack_20 = path;
  path_local = (char *)dhm;
  n._4_4_ = load_file(path,&local_38,(size_t *)&buf);
  dhm_local._4_4_ = n._4_4_;
  if (n._4_4_ == 0) {
    n._4_4_ = mbedtls_dhm_parse_dhm((mbedtls_dhm_context *)path_local,local_38,(size_t)buf);
    mbedtls_zeroize(local_38,(size_t)buf);
    free(local_38);
    dhm_local._4_4_ = n._4_4_;
  }
  return dhm_local._4_4_;
}

Assistant:

int mbedtls_dhm_parse_dhmfile( mbedtls_dhm_context *dhm, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_dhm_parse_dhm( dhm, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}